

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

bool helics::changeDetected
               (defV *prevValue,vector<double,_std::allocator<double>_> *val,double deltaV)

{
  pointer pdVar1;
  pointer pdVar2;
  ulong uVar3;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  bVar8 = true;
  if ((prevValue->
      super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ).
      super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      ._M_index == '\x04') {
    pvVar4 = std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (prevValue);
    pdVar1 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar1;
    pdVar2 = (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (lVar5 == (long)(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar2) {
      uVar6 = lVar5 >> 3;
      uVar3 = 0;
      do {
        uVar7 = uVar3;
        if (uVar6 == uVar7) break;
        uVar3 = uVar7 + 1;
      } while (ABS(pdVar2[uVar7] - pdVar1[uVar7]) <= deltaV);
      bVar8 = uVar7 < uVar6;
    }
  }
  return bVar8;
}

Assistant:

bool changeDetected(const defV& prevValue, const std::vector<double>& val, double deltaV)
{
    if (prevValue.index() == vector_loc) {
        const auto& prevV = std::get<std::vector<double>>(prevValue);
        if (val.size() == prevV.size()) {
            for (size_t ii = 0; ii < val.size(); ++ii) {
                if (std::abs(prevV[ii] - val[ii]) > deltaV) {
                    return true;
                }
            }
            return false;
        }
    }
    return true;
}